

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screenshot.hpp
# Opt level: O2

void __thiscall
Outputs::Display::OpenGL::Screenshot::Screenshot
          (Screenshot *this,int aspect_width,int aspect_height)

{
  pointer puVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  undefined8 extraout_RDX;
  long lVar4;
  ulong uVar5;
  pointer __src;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  GLint dimensions [4];
  long local_48;
  undefined4 local_34 [2];
  int prior_alignment;
  
  (this->pixel_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pixel_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pixel_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  glGetIntegerv(0xba2,local_88);
  this->height = dimensions[1];
  iVar3 = (aspect_width * dimensions[1]) / aspect_height;
  this->width = iVar3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->pixel_data,(long)(dimensions[1] * iVar3 * 4));
  glGetIntegerv(0xd05,local_34);
  glReadPixels(dimensions[0] - this->width >> 1,0,this->width,this->height,0x1908,0x1401,
               (this->pixel_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  glPixelStorei(0xd05,local_34[0],extraout_RDX,0x3f6adc);
  __n = (size_t)(this->width << 2);
  local_48 = 0;
  lVar4 = 0;
  for (uVar5 = 0; uVar5 < (ulong)(long)this->height >> 1; uVar5 = uVar5 + 1) {
    lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
    puVar1 = (this->pixel_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __src = puVar1 + ((this->height + -1) + lVar4) * __n;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x3f6b8f;
    memcpy(local_88 + lVar2,__src,__n);
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x3f6ba8;
    memcpy(__src,puVar1 + local_48,__n);
    puVar1 = (this->pixel_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0x3f6bba;
    memcpy(puVar1 + local_48,local_88 + lVar2,__n);
    lVar4 = lVar4 + -1;
    local_48 = local_48 + __n;
  }
  return;
}

Assistant:

Screenshot(int aspect_width, int aspect_height) {
		// Get the current viewport to establish framebuffer size. Then determine how wide the
		// centre portion of that would be, allowing for the requested aspect ratio.
		GLint dimensions[4];
		glGetIntegerv(GL_VIEWPORT, dimensions);

		height = int(dimensions[3]);
		width = (height * aspect_width) / aspect_height;
		pixel_data.resize(size_t(width * height * 4));

		// Grab the framebuffer contents, temporarily setting single-byte alignment.
		int prior_alignment;
		glGetIntegerv(GL_PACK_ALIGNMENT, &prior_alignment);
		glReadPixels((dimensions[2] - GLint(width)) >> 1, 0, GLint(width), GLint(height), GL_RGBA, GL_UNSIGNED_BYTE, pixel_data.data());
		glPixelStorei(GL_PACK_ALIGNMENT, prior_alignment);

		// Flip the contents into raster order.
		const size_t line_size = size_t(width * 4);
		for(size_t y = 0; y < size_t(height) / 2; ++y) {
			const size_t flipped_y = size_t(height - 1) - y;

			uint8_t temp[line_size];
			memcpy(temp, &pixel_data[flipped_y * line_size], line_size);
			memcpy(&pixel_data[flipped_y * line_size], &pixel_data[y * line_size], line_size);
			memcpy(&pixel_data[y * line_size], temp, line_size);
		}
	}